

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
::
ReadLinearExpr<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::ObjHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
           *this)

{
  long *plVar1;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this_00;
  char cVar2;
  int iVar3;
  int num_linear_terms;
  int iVar4;
  int iVar5;
  LinearObjHandler linear_expr;
  
  iVar3 = NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          ::ReadUInt((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                      *)this,*(uint *)(*(long *)(this + 8) + 8));
  num_linear_terms =
       NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       ::ReadUInt((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                   *)this,1,**(int **)(this + 8) + 1);
  TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  plVar1 = *(long **)(this + 0x10);
  cVar2 = (**(code **)(*plVar1 + 0x18))(plVar1);
  if (cVar2 == '\0') {
    iVar4 = (**(code **)(*plVar1 + 0x10))(plVar1);
    if (iVar4 + -1 != iVar3) {
      NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
      ::ReadLinearExpr<mp::internal::NullLinearExprHandler>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *)this,num_linear_terms);
      return;
    }
  }
  this_00 = *(NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> **)(this + 0x10);
  iVar5 = (*this_00->_vptr_NLProblemBuilder[3])(this_00);
  iVar4 = 0;
  if ((char)iVar5 != '\0') {
    iVar4 = iVar3;
  }
  linear_expr = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnLinearObjExpr
                          (this_00,iVar4,num_linear_terms);
  ReadLinearExpr<mp::BasicProblem<mp::BasicProblemParams<int>>::LinearExprBuilder>
            (this,num_linear_terms,(LinearExprBuilder)linear_expr.expr_);
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr() {
  LinearHandler lh(*this);
  int index = ReadUInt(lh.num_items());
  // The number of terms should be less than num_vars because common
  // expressions are not allowed in a linear expression.
  int num_terms = ReadUInt(1, header_.num_vars + 1u);
  reader_.ReadTillEndOfLine();
  if (lh.SkipExpr(index))
    ReadLinearExpr(num_terms, NullLinearExprHandler());
  else
    ReadLinearExpr(num_terms, lh.OnLinearExpr(index, num_terms));
}